

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelVoidsElement::~IfcRelVoidsElement(IfcRelVoidsElement *this)

{
  ~IfcRelVoidsElement((IfcRelVoidsElement *)
                      &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name);
  return;
}

Assistant:

IfcRelVoidsElement() : Object("IfcRelVoidsElement") {}